

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS ref_grid_face_with(REF_GRID ref_grid,REF_INT node_per,REF_CELL *ref_cell)

{
  long lVar1;
  
  *ref_cell = (REF_CELL)0x0;
  if (node_per == 3) {
    lVar1 = 0x28;
  }
  else {
    if (node_per != 4) {
      printf("node_per %d\n");
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x13f,
             "ref_grid_face_with",1,"unexpected node_per");
      return 1;
    }
    lVar1 = 0x40;
  }
  *ref_cell = *(REF_CELL *)((long)ref_grid->cell + lVar1 + -0x10);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_grid_face_with(REF_GRID ref_grid, REF_INT node_per,
                                      REF_CELL *ref_cell) {
  *ref_cell = NULL;

  switch (node_per) {
    case 3:
      *ref_cell = ref_grid_tri(ref_grid);
      break;
    case 4:
      *ref_cell = ref_grid_qua(ref_grid);
      break;
    default:
      printf("node_per %d\n", node_per);
      RSS(REF_FAILURE, "unexpected node_per");
      break;
  }

  return REF_SUCCESS;
}